

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ColumnRef __thiscall
clickhouse::ColumnVector<unsigned_int>::Slice
          (ColumnVector<unsigned_int> *this,size_t begin,size_t len)

{
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ColumnRef CVar2;
  undefined1 local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  ColumnVector<unsigned_int> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  SliceVector<unsigned_int>
            (&local_40,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(begin + 0x28),len,
             in_RCX);
  local_28 = (ColumnVector<unsigned_int> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<clickhouse::ColumnVector<unsigned_int>,std::allocator<clickhouse::ColumnVector<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (a_Stack_20,&local_28,(allocator<clickhouse::ColumnVector<unsigned_int>_> *)&local_41,
             &local_40);
  std::__shared_ptr<clickhouse::ColumnVector<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<clickhouse::ColumnVector<unsigned_int>,clickhouse::ColumnVector<unsigned_int>>
            ((__shared_ptr<clickhouse::ColumnVector<unsigned_int>,(__gnu_cxx::_Lock_policy)2> *)
             &local_28,local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)local_28;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_28 = (ColumnVector<unsigned_int> *)0x0;
  _Var1._M_pi = extraout_RDX;
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX_00;
  }
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnVector<T>::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnVector<T>>(SliceVector(data_, begin, len));
}